

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O0

int __thiscall dit::DebaseTests::init(DebaseTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SelfCheckCase *pSVar1;
  DebaseTests *this_local;
  
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"int32",
             "deInt32_selfTest()",deInt32_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"float16",
             "deFloat16_selfTest()",deFloat16_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"math","deMath_selfTest()",
             deMath_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"sha1","deSha1_selfTest()",
             deSha1_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (SelfCheckCase *)operator_new(0x78);
  SelfCheckCase::SelfCheckCase
            (pSVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"memory",
             "deMemory_selfTest()",deMemory_selfTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "int32",		"deInt32_selfTest()",	deInt32_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "float16",	"deFloat16_selfTest()",	deFloat16_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "math",		"deMath_selfTest()",	deMath_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "sha1",		"deSha1_selfTest()",	deSha1_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "memory",		"deMemory_selfTest()",	deMemory_selfTest));
	}